

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O0

ans_sint_decode * ans_sint_decode::load(uint8_t *in_u8)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  unsigned_short uVar1;
  int iVar2;
  reference puVar3;
  pointer puVar4;
  size_type sVar5;
  uchar *puVar6;
  reference pvVar7;
  uchar *puVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_RDI;
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  dec_entry_sint *entry_1;
  dec_entry_sint *entry_2;
  uint32_t k_1;
  value_type cur_freq_1;
  size_t sym_1;
  dec_entry_sint *table_1;
  dec_entry_sint_small *entry;
  uint32_t k;
  value_type cur_freq;
  size_t sym;
  dec_entry_sint_small *table;
  uint32_t cur_base;
  uint64_t tmp;
  size_type max_sym;
  uint max_norm_freq;
  ans_sint_decode *model;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint uVar11;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff20;
  ans_sint_decode *this;
  uint local_b8;
  ulong local_b0;
  uint local_98;
  ulong local_90;
  uint local_7c;
  uint8_t *in_stack_ffffffffffffff98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  uint local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  undefined1 local_11;
  undefined1 extraout_var [56];
  
  auVar9 = in_ZMM0._0_16_;
  local_11 = 0;
  this = (ans_sint_decode *)in_RDI._M_current;
  ans_sint_decode((ans_sint_decode *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  ans_load_interp(in_stack_ffffffffffffff98);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff20._M_current,&local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff20._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff08._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff08._M_current);
  local_48 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (in_RDI,in_stack_ffffffffffffff20);
  puVar3 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator*(&local_48);
  local_40 = *puVar3;
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff08._M_current);
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff08._M_current);
  __first._M_current._4_4_ = in_stack_ffffffffffffff14;
  __first._M_current._0_4_ = in_stack_ffffffffffffff10;
  iVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (__first,in_stack_ffffffffffffff08,0);
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)in_RDI._M_current + 0x18))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(long)iVar2;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)in_RDI._M_current + 0x18))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               ((long)in_RDI._M_current + 0x18))->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + -1);
  auVar9 = vcvtusi2sd_avx512f(auVar9,(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      ((long)in_RDI._M_current + 0x18))->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
  auVar10._0_8_ = log2(auVar9._0_8_);
  auVar10._8_56_ = extraout_var;
  puVar4 = (pointer)vcvttsd2usi_avx512f(auVar10._0_16_);
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)in_RDI._M_current + 0x18))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar4;
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI._M_current);
  local_7c = 0;
  uVar11 = local_40;
  uVar1 = std::numeric_limits<unsigned_short>::max();
  if (uVar1 < uVar11) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (size_type)in_RDI._M_current);
    *(undefined4 *)
     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)in_RDI._M_current + 0x30))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = 1;
    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x183a63);
    for (local_b0 = 0; local_b0 <= sVar5 - 1; local_b0 = local_b0 + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI._M_current,
                          local_b0);
      uVar11 = *pvVar7;
      if (uVar11 != 0) {
        for (local_b8 = 0; local_b8 < uVar11; local_b8 = local_b8 + 1) {
          *(uint *)(puVar6 + (ulong)(local_7c + local_b8) * 0xc) = uVar11;
          *(int *)(puVar6 + (ulong)(local_7c + local_b8) * 0xc + 8) = (int)local_b0;
          *(uint *)(puVar6 + (ulong)(local_7c + local_b8) * 0xc + 4) = local_b8;
        }
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI._M_current
                            ,local_b0);
        local_7c = *pvVar7 + local_7c;
      }
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (size_type)in_RDI._M_current);
    *(undefined4 *)
     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)in_RDI._M_current + 0x30))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = 0;
    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x183938);
    for (local_90 = 0; local_90 <= sVar5 - 1; local_90 = local_90 + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI._M_current,
                          local_90);
      uVar11 = *pvVar7;
      for (local_98 = 0; local_98 < uVar11; local_98 = local_98 + 1) {
        puVar8 = puVar6 + (ulong)local_98 * 8 + (ulong)local_7c * 8;
        *(short *)puVar8 = (short)uVar11;
        *(int *)(puVar8 + 4) = (int)local_90;
        *(short *)(puVar8 + 2) = (short)local_98;
      }
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI._M_current,
                          local_90);
      local_7c = *pvVar7 + local_7c;
    }
  }
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)in_RDI._M_current + 0x30))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              ((long)in_RDI._M_current + 0x18))->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start << 4);
  return this;
}

Assistant:

static ans_sint_decode load(const uint8_t* in_u8)
    {
        ans_sint_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        if (max_norm_freq <= std::numeric_limits<uint16_t>::max()) {
            model.table.resize(model.frame_size * sizeof(dec_entry_sint_small));
            model.table_type = dec_table_type_sint::SINT_SMALL;
            auto table
                = reinterpret_cast<dec_entry_sint_small*>(model.table.data());
            for (size_t sym = 0; sym <= max_sym; sym++) {
                auto cur_freq = model.nfreqs[sym];
                for (uint32_t k = 0; k < cur_freq; k++) {
                    dec_entry_sint_small* entry = table + cur_base + k;
                    entry->freq = cur_freq;
                    entry->sym = sym;
                    entry->offset = k;
                }
                cur_base += model.nfreqs[sym];
            }
        } else {
            model.table.resize(model.frame_size * sizeof(dec_entry_sint));
            model.table_type = dec_table_type_sint::SINT_LARGE;
            auto table = reinterpret_cast<dec_entry_sint*>(model.table.data());
            for (size_t sym = 0; sym <= max_sym; sym++) {
                auto cur_freq = model.nfreqs[sym];
                if (cur_freq == 0)
                    continue;
                for (uint32_t k = 0; k < cur_freq; k++) {
                    dec_entry_sint* entry = table + cur_base + k;
                    table[cur_base + k].freq = cur_freq;
                    table[cur_base + k].sym = sym;
                    table[cur_base + k].offset = k;
                }
                dec_entry_sint* entry = table + cur_base;
                cur_base += model.nfreqs[sym];
            }
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }